

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_write_poc(opj_j2k_t *j2k)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  int iVar3;
  opj_tcp_t *poVar4;
  opj_tccp_t *poVar5;
  opj_cio_t *cio;
  OPJ_UINT32 OVar6;
  opj_poc_t *poVar7;
  long lVar8;
  uint n;
  
  OVar1 = j2k->image->numcomps;
  poVar4 = j2k->cp->tcps;
  iVar2 = j2k->curtileno;
  poVar7 = poVar4[iVar2].pocs;
  poVar5 = poVar4[iVar2].tccps;
  cio = j2k->cio;
  iVar3 = poVar4[iVar2].numpocs;
  cio_write(cio,0xff5f,2);
  n = (0x100 < (int)OVar1) + 1;
  cio_write(cio,((ulong)n * 2 + 5) * ((long)iVar3 + 1) + 2,2);
  for (lVar8 = 0; lVar8 <= iVar3; lVar8 = lVar8 + 1) {
    cio_write(cio,(ulong)poVar7->resno0,1);
    cio_write(cio,(ulong)poVar7->compno0,n);
    cio_write(cio,(ulong)poVar7->layno1,2);
    OVar6 = poVar4[iVar2].numlayers;
    if ((int)poVar7->layno1 < poVar4[iVar2].numlayers) {
      OVar6 = poVar7->layno1;
    }
    poVar7->layno1 = OVar6;
    cio_write(cio,(ulong)poVar7->resno1,1);
    OVar6 = poVar5->numresolutions;
    if ((int)poVar7->resno1 < (int)OVar6) {
      OVar6 = poVar7->resno1;
    }
    poVar7->resno1 = OVar6;
    cio_write(cio,(ulong)poVar7->compno1,n);
    OVar6 = poVar7->compno1;
    if ((int)OVar1 <= (int)poVar7->compno1) {
      OVar6 = OVar1;
    }
    poVar7->compno1 = OVar6;
    cio_write(cio,(long)poVar7->prg,1);
    poVar7 = poVar7 + 1;
  }
  return;
}

Assistant:

static void j2k_write_poc(opj_j2k_t *j2k) {
	int len, numpchgs, i;

	int numcomps = j2k->image->numcomps;
	
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_cio_t *cio = j2k->cio;

	numpchgs = 1 + tcp->numpocs;
	cio_write(cio, J2K_MS_POC, 2);	/* POC  */
	len = 2 + (5 + 2 * (numcomps <= 256 ? 1 : 2)) * numpchgs;
	cio_write(cio, len, 2);		/* Lpoc */
	for (i = 0; i < numpchgs; i++) {
		opj_poc_t *poc = &tcp->pocs[i];
		cio_write(cio, poc->resno0, 1);	/* RSpoc_i */
		cio_write(cio, poc->compno0, (numcomps <= 256 ? 1 : 2));	/* CSpoc_i */
		cio_write(cio, poc->layno1, 2);	/* LYEpoc_i */
		poc->layno1 = int_min(poc->layno1, tcp->numlayers);
		cio_write(cio, poc->resno1, 1);	/* REpoc_i */
		poc->resno1 = int_min(poc->resno1, tccp->numresolutions);
		cio_write(cio, poc->compno1, (numcomps <= 256 ? 1 : 2));	/* CEpoc_i */
		poc->compno1 = int_min(poc->compno1, numcomps);
		cio_write(cio, poc->prg, 1);	/* Ppoc_i */
	}
}